

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O1

TPZAutoPointer<TPZMatrix<double>_> __thiscall
TPZSTShiftOrigin<double>::CalcMatrix
          (TPZSTShiftOrigin<double> *this,TPZAutoPointer<TPZMatrix<double>_> *A)

{
  TPZReference *pTVar1;
  TPZSpectralTransform<double> TVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  TPZSpectralTransform<double> *in_RDX;
  long lVar6;
  double local_30;
  
  TVar2 = *in_RDX;
  lVar3 = *(long *)(*(long *)TVar2 + 8);
  this->super_TPZSpectralTransform<double> = TVar2;
  LOCK();
  *(int *)((long)TVar2 + 8) = *(int *)((long)TVar2 + 8) + 1;
  UNLOCK();
  if (0 < lVar3) {
    pTVar1 = A[1].fRef;
    lVar6 = 0;
    do {
      plVar4 = *(long **)this->super_TPZSpectralTransform<double>;
      plVar5 = *(long **)this->super_TPZSpectralTransform<double>;
      local_30 = (double)(**(code **)(*plVar5 + 0x120))(plVar5,lVar6,lVar6);
      local_30 = local_30 - (double)pTVar1;
      (**(code **)(*plVar4 + 0x118))(plVar4,lVar6,lVar6,&local_30);
      lVar6 = lVar6 + 1;
    } while (lVar3 != lVar6);
  }
  return (TPZAutoPointer<TPZMatrix<double>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A) const
{
  const auto nRows = A->Rows();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //calculating A-sigmaB
  const auto &shift = Shift();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}